

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_dtor.cpp
# Opt level: O3

int main(void)

{
  __sighandler_t __handler;
  A *value_00;
  int value;
  A a;
  signal<void_()> signal;
  int local_a0 [2];
  A local_98;
  signal<void_()> local_80;
  
  local_80.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00105d78;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_80.m_slots.m_first._0_5_ = 0;
  local_80.m_slots.m_first._5_3_ = 0;
  local_80.m_slots.m_last._0_5_ = 0;
  local_80.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_80.m_slots.m_delete_cv);
  local_a0[0] = 0;
  A::A(&local_98,&local_80,local_a0);
  local_a0[1] = 0;
  expect_eq<int,int>(local_a0,local_a0 + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x1c);
  obs::signal<void_()>::operator()<>(&local_80);
  local_a0[1] = 1;
  expect_eq<int,int>(local_a0,local_a0 + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x1e);
  obs::connection::disconnect((connection *)&local_98);
  obs::signal<void_()>::operator()<>(&local_80);
  value_00 = &local_98;
  local_98.m_conn.m_conn.m_signal._0_4_ = 1;
  expect_eq<int,int>(local_a0,(int *)value_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x21);
  obs::signal<void_()>::~signal(&local_80,(int)value_00,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> signal;
  int value = 0;
  {
    A a(signal, value);
    EXPECT_EQ(value, 0);
    signal();
    EXPECT_EQ(value, 1);
  }
  signal();
  EXPECT_EQ(value, 1);
}